

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O2

int ORPG::Core::getopt_long(int argc,char **argv,char *optstring,option *longopts,int *index)

{
  char *__s2;
  FILE *pFVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  int iVar9;
  char *__s;
  int iVar10;
  option *poVar11;
  
  if (optstring == (char *)0x0) {
    return -1;
  }
  if (optind == 0) {
    optind = 1;
    optreset = optind;
  }
  iVar3 = getopt_internal(argc,argv,optstring);
  iVar9 = optind;
  if (iVar3 != -2) {
    return iVar3;
  }
  lVar8 = (long)optind;
  optind = optind + 1;
  if (argv[lVar8][2] == '\0') {
    return -1;
  }
  __s = argv[lVar8] + 2;
  pcVar6 = strchr(__s,0x3d);
  if (pcVar6 == (char *)0x0) {
    sVar7 = strlen(__s);
    uVar4 = (uint)sVar7;
    pcVar6 = (char *)0x0;
  }
  else {
    uVar4 = (int)pcVar6 - (int)__s;
    pcVar6 = pcVar6 + 1;
  }
  iVar3 = -1;
  iVar10 = 0;
  for (poVar11 = longopts; pFVar1 = _stderr, __s2 = poVar11->name, __s2 != (char *)0x0;
      poVar11 = poVar11 + 1) {
    iVar5 = strncmp(__s,__s2,(long)(int)uVar4);
    if (iVar5 == 0) {
      sVar7 = strlen(__s2);
      if (sVar7 == uVar4) goto LAB_0010281e;
      if (iVar3 == -1) {
        iVar3 = iVar10;
      }
    }
    iVar10 = iVar10 + 1;
  }
  iVar10 = iVar3;
  if (iVar3 == -1) {
    if (opterr == 0) {
      return 0x3f;
    }
    if (*optstring != ':') {
      pcVar6 = program_name(*argv);
      fprintf(pFVar1,"%s: illegal option -- %s\n",pcVar6,__s);
      return 0x3f;
    }
    return 0x3f;
  }
LAB_0010281e:
  pFVar1 = _stderr;
  if ((longopts[iVar10].has_arg - 1U < 2) && (optarg = pcVar6, pcVar6 == (char *)0x0)) {
    optind = iVar9 + 2;
    optarg = argv[lVar8 + 1];
    if ((longopts[iVar10].has_arg == 1) && (optarg == (char *)0x0)) {
      cVar2 = *optstring;
      if (opterr != 0) {
        if (cVar2 == ':') {
          return 0x3a;
        }
        pcVar6 = program_name(*argv);
        fprintf(pFVar1,"%s: option requires an argument -- %s\n",pcVar6,__s);
        cVar2 = *optstring;
      }
      if (cVar2 == ':') {
        return 0x3a;
      }
      return 0x3f;
    }
  }
  iVar9 = longopts[iVar10].val;
  if (longopts[iVar10].flag != (int *)0x0) {
    *longopts[iVar10].flag = iVar9;
    iVar9 = 0;
  }
  if (index != (int *)0x0) {
    *index = iVar10;
  }
  return iVar9;
}

Assistant:

int getopt_long(int argc, char* argv[],
                        const char* optstring,
                        const struct option* longopts,
                        int* index) {
            if(optstring == NULL)
                return EOF;

            /* lets make sure we don't
            check the program name */
            if(optind == 0)
                optind = optreset = 1;

            int retval = EOF;

            if ((retval = getopt_internal(argc, argv, optstring)) == CONTINUE_CODE) {
                char *current_argv = argv[optind++] + 2, *has_equal;
                int i, current_argv_len, match = EOF;

                /* Check to make sure we have not reached a null ('\0') terminator*/
                if (*current_argv == '\0') return EOF;

                /* if our option has a '=' after it (i.e openrpg --roll=5d6)
                then do not count it in our length */
                if ((has_equal = strchr(current_argv, '=')) != NULL) {
                    current_argv_len = has_equal - current_argv;
                    has_equal++;
                } else
                    current_argv_len = strlen(current_argv);

                /* Check if our current option is in our list of longopts */
                for (i = 0; longopts[i].name; i++) {

                    /* Move though the list until we find a match */
                    if (strncmp(current_argv, longopts[i].name, current_argv_len))
                        continue;

                    if (strlen(longopts[i].name) == (unsigned)current_argv_len) {
                        match = i;

                        break;
                    }

                    /* something has gone wrong if we get here*/
                    if (match == EOF) match = i;
                }

                /* if we found a match then lets check if it has an argument */
                if (match != EOF) {
                    /* there could be an arguement! */
                    if (longopts[match].has_arg == required_argument ||
                        longopts[match].has_arg == optional_argument) {

                        /* if there was an equal ('=') then lets move to it
                        otherwise just increment by 1 */
                        if (has_equal)
                            optarg = has_equal;
                        else
                            optarg = argv[optind++];
                    }

                    /* if an argument is required lets make sure we have it*/
                    if ((longopts[match].has_arg == required_argument)
                        && (optarg == NULL)) {
                        /*
                        * Missing argument, leading :
                        * indicates no error should be generated
                        */
                        if ((opterr) && (*optstring != ':'))
                            fprintf(stderr,
                                    "%s: option requires an argument -- %s\n",
                                    program_name(argv[0]),
                                    current_argv);
                        return (((*optstring == ':') ? BADARG : BADCHAR));
                    }
                } else {
                    /* No matching argument */
                    if ((opterr) && (*optstring != ':'))
                        fprintf(stderr,
                                "%s: illegal option -- %s\n",
                                program_name(argv[0]),
                                current_argv);
                    return BADCHAR;
                }

                if (longopts[match].flag) {
                    *longopts[match].flag = longopts[match].val;
                    retval = 0;
                } else
                    retval = longopts[match].val;

                if (index)
                    *index = match;
            }

            return retval;
        }